

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O3

void __thiscall
glslang::TParseContext::mergeQualifiers
          (TParseContext *this,TSourceLoc *loc,TQualifier *dst,TQualifier *src,bool force)

{
  _Rb_tree_header *p_Var1;
  undefined8 uVar2;
  TSpirvDecorate *pTVar3;
  TSpirvDecorate *this_00;
  _func_int *UNRECOVERED_JUMPTABLE;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  uint uVar7;
  uint uVar8;
  int iVar9;
  ulong uVar10;
  _Base_ptr p_Var11;
  _Base_ptr p_Var12;
  uint uVar13;
  uint uVar14;
  _Base_ptr p_Var15;
  char *pcVar16;
  ulong uVar17;
  uint uVar18;
  TMap<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>_> *__range3;
  _Rb_tree_header *p_Var19;
  uint uVar20;
  uint uVar21;
  uint uVar22;
  uint uVar23;
  uint uVar24;
  byte bVar25;
  ushort uVar26;
  uint uVar27;
  uint uVar28;
  uint uVar29;
  uint uVar30;
  TParseContext *this_01;
  uint uVar31;
  uint uVar32;
  uint uVar33;
  uint uVar34;
  uint uVar35;
  uint uVar36;
  uint uVar37;
  TSpirvDecorate *dstSpirvDecorate;
  
  uVar10 = *(ulong *)&src->field_0x8;
  this_01 = this;
  if (((uVar10 & 0x318020000000) != 0) && ((*(ulong *)&dst->field_0x8 & 0x318020000000) != 0)) {
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,"can only have one auxiliary qualifier (centroid, patch, and sample)","","")
    ;
    uVar10 = *(ulong *)&src->field_0x8;
  }
  if (((uVar10 & 0x60c0000000) != 0) && ((*(ulong *)&dst->field_0x8 & 0x60c0000000) != 0)) {
    this_01 = this;
    (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
              (this,loc,
               "can only have one interpolation qualifier (flat, smooth, noperspective, __explicitInterpAMD)"
               ,"","");
  }
  if (!force) {
    iVar9 = 0x1a4;
    if ((this->super_TParseContextBase).super_TParseVersions.profile == EEsProfile) {
      iVar9 = 0x136;
    }
    if (((this->super_TParseContextBase).super_TParseVersions.version < iVar9) &&
       (this_01 = this,
       iVar9 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[8])
                         (this,"GL_ARB_shading_language_420pack"), (char)iVar9 == '\0')) {
      uVar10 = *(ulong *)&src->field_0x8;
      if (((uVar10 & 0x1000000000) != 0) && ((*(ulong *)&dst->field_0x8 & 0x31e0fe00007f) != 0)) {
        this_01 = this;
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"precise qualifier must appear first","","");
        uVar10 = *(ulong *)&src->field_0x8;
      }
      if ((((uint)uVar10 >> 0x1c & 1) == 0) || ((*(ulong *)&dst->field_0x8 & 0x31e0ee00007f) == 0))
      {
        if (((uVar10 & 0x60c0000000) != 0) && ((*(ulong *)&dst->field_0x8 & 0x31802e00007f) != 0)) {
          pcVar16 = "interpolation qualifiers must appear before storage and precision qualifiers";
          goto LAB_00425aef;
        }
        if (((uVar10 & 0x318020000000) != 0) && ((*(uint *)&dst->field_0x8 & 0xe00007f) != 0)) {
          pcVar16 = 
          "Auxiliary qualifiers (centroid, patch, and sample) must appear before storage and precision qualifiers"
          ;
          goto LAB_00425aef;
        }
        if (((uVar10 & 0x7f) != 0) && ((dst->field_0xb & 0xe) != 0)) {
          pcVar16 = "precision qualifier must appear as last qualifier";
          goto LAB_00425aef;
        }
      }
      else {
        pcVar16 = 
        "invariant qualifier must appear before interpolation, storage, and precision qualifiers ";
LAB_00425aef:
        this_01 = this;
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,pcVar16,"","");
      }
      uVar10 = *(ulong *)&src->field_0x8;
      if ((((uVar10 & 0x1000000000) != 0) && ((*(uint *)&dst->field_0x8 & 0x7f) < 0x12)) &&
         ((0x30004U >> (*(uint *)&dst->field_0x8 & 0x1f) & 1) != 0)) {
        this_01 = this;
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"precise qualifier must appear first","","");
        uVar10 = *(ulong *)&src->field_0x8;
      }
      if ((((uint)uVar10 & 0x7f) == 2) && ((*(uint *)&dst->field_0x8 & 0x7e) == 0x10)) {
        this_01 = this;
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"in/out must appear before const","","");
      }
    }
  }
  uVar10 = *(ulong *)&dst->field_0x8;
  uVar13 = (uint)uVar10 & 0x7f;
  if (uVar13 < 2) {
    uVar10 = uVar10 & 0xffffffffffffff80 | (ulong)((uint)*(undefined8 *)&src->field_0x8 & 0x7f);
  }
  else {
    if ((uVar13 != 0x10) || ((*(uint *)&src->field_0x8 & 0x7f) != 0x11)) {
      uVar24 = (uint)uVar10 & 0x7f;
      uVar13 = (uint)*(undefined8 *)&src->field_0x8;
      if (uVar24 == 2) {
        if ((uVar13 & 0x7f) == 0x10) {
LAB_00425c0c:
          uVar10 = uVar10 & 0xffffffffffffff80 | 0x13;
          goto LAB_00425c14;
        }
      }
      else if (uVar24 == 0x10) {
        if ((uVar13 & 0x7f) == 2) goto LAB_00425c0c;
      }
      else if ((uVar24 == 0x11) && ((uVar13 & 0x7f) == 0x10)) goto LAB_00425bf4;
      if (1 < (uVar13 & 0x7f)) {
        uVar13 = (uVar13 & 0x7f) - 2;
        if (uVar13 < 0x1d) {
          pcVar16 = &DAT_007315bc + *(int *)(&DAT_007315bc + (ulong)uVar13 * 4);
        }
        else {
          pcVar16 = "unknown qualifier";
        }
        this_01 = this;
        (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                  (this,loc,"too many storage qualifiers",pcVar16,"");
      }
      goto LAB_00425c18;
    }
LAB_00425bf4:
    uVar10 = uVar10 & 0xffffffffffffff80 | 0x12;
  }
LAB_00425c14:
  *(ulong *)&dst->field_0x8 = uVar10;
LAB_00425c18:
  if (force) {
    uVar10 = *(ulong *)&src->field_0x8 & 0xe000000;
    if ((*(ulong *)&dst->field_0x8 & 0xe000000) == 0 || uVar10 != 0) {
      *(ulong *)&dst->field_0x8 = uVar10 | *(ulong *)&dst->field_0x8 & 0xfffffffff1ffffff;
    }
  }
  else {
    uVar13 = *(uint *)&src->field_0x8 >> 0x19 & 7;
    uVar10 = *(ulong *)&dst->field_0x8;
    if ((uVar10 & 0xe000000) != 0 && uVar13 != 0) {
      uVar13 = uVar13 - 1;
      if (uVar13 < 3) {
        pcVar16 = &DAT_00731630 + *(int *)(&DAT_00731630 + (ulong)uVar13 * 4);
      }
      else {
        pcVar16 = "unknown precision qualifier";
      }
      this_01 = this;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,"only one precision qualifier allowed",pcVar16,"");
      uVar10 = *(ulong *)&dst->field_0x8;
    }
    if ((uVar10 & 0xe000000) == 0) {
      uVar10 = uVar10 | (uint)*(undefined8 *)&src->field_0x8 & 0xe000000;
      *(ulong *)&dst->field_0x8 = uVar10;
    }
    uVar17 = *(ulong *)&src->field_0x8;
    if (((((((uVar17 & 0x2000000000000) != 0) && ((uVar10 & 0x1f0000000000000) != 0)) ||
          (((uVar17 & 0x10000000000000) != 0 && ((uVar10 & 0x1e2000000000000) != 0)))) ||
         (((uVar17 & 0x20000000000000) != 0 && ((uVar10 & 0x1d2000000000000) != 0)))) ||
        (((uVar17 & 0x40000000000000) != 0 && ((uVar10 & 0x1b2000000000000) != 0)))) ||
       ((((uVar17 & 0x80000000000000) != 0 && ((uVar10 & 0x172000000000000) != 0)) ||
        (((uVar17 & 0x100000000000000) != 0 && ((uVar10 & 0xf2000000000000) != 0)))))) {
      uVar13 = (uint)(uVar17 >> 0x19) & 7;
      if (uVar13 < 4) {
        pcVar16 = *(char **)(&DAT_0092ae60 + (ulong)uVar13 * 8);
      }
      else {
        pcVar16 = "unknown precision qualifier";
      }
      this_01 = this;
      (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                (this,loc,
                 "only one coherent/devicecoherent/queuefamilycoherent/workgroupcoherent/subgroupcoherent/shadercallcoherent qualifier allowed"
                 ,pcVar16,"");
    }
  }
  uVar24 = 0;
  mergeObjectLayoutQualifiers(this_01,dst,src,false);
  uVar10 = *(ulong *)&dst->field_0x8;
  uVar20 = (uint)(*(ulong *)&src->field_0x8 >> 0x1c) & 1;
  uVar13 = (uint)uVar10;
  if ((uVar13 >> 0x1c & 1) == 0) {
    uVar20 = 0;
  }
  uVar17 = (uint)*(ulong *)&src->field_0x8 & 0x10000000 | uVar10;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar14 = (uint)(*(ulong *)&src->field_0x8 >> 0x1d) & 1;
  if ((uVar13 >> 0x1d & 1) == 0) {
    uVar14 = 0;
  }
  uVar17 = (uint)*(ulong *)&src->field_0x8 & 0x20000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar4 = (uint)(*(ulong *)&src->field_0x8 >> 0x1e) & 1;
  if ((uVar13 >> 0x1e & 1) == 0) {
    uVar4 = uVar24;
  }
  uVar17 = (uint)*(ulong *)&src->field_0x8 & 0x40000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar2 = *(undefined8 *)&src->field_0x8;
  uVar17 = (uint)uVar2 & 0x80000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar31 = (uint)(*(ulong *)&src->field_0x8 >> 0x20) & 1;
  if ((uVar10 >> 0x20 & 1) == 0) {
    uVar31 = 0;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x100000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar5 = (uint)(*(ulong *)&src->field_0x8 >> 0x24) & 1;
  if ((uVar10 & 0x1000000000) == 0) {
    uVar5 = uVar24;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x1000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar27 = (uint)(*(ulong *)&src->field_0x8 >> 0x25) & 1;
  if ((uVar10 >> 0x25 & 1) == 0) {
    uVar27 = 0;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x2000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar21 = (uint)(*(ulong *)&src->field_0x8 >> 0x26) & 1;
  if ((uVar10 >> 0x26 & 1) == 0) {
    uVar21 = 0;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x4000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar32 = (uint)(*(ulong *)&src->field_0x8 >> 0x29) & 1;
  if ((uVar10 >> 0x29 & 1) == 0) {
    uVar32 = 0;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x20000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar28 = (uint)(*(ulong *)&src->field_0x8 >> 0x2a) & 1;
  if ((uVar10 >> 0x2a & 1) == 0) {
    uVar28 = 0;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x40000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar22 = (uint)(*(ulong *)&src->field_0x8 >> 0x2b) & 1;
  if ((uVar10 >> 0x2b & 1) == 0) {
    uVar22 = 0;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x80000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar6 = (uint)(*(ulong *)&src->field_0x8 >> 0x2c) & 1;
  if ((uVar10 >> 0x2c & 1) == 0) {
    uVar6 = uVar24;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x100000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar37 = (uint)(*(ulong *)&src->field_0x8 >> 0x2d) & 1;
  if ((uVar10 >> 0x2d & 1) == 0) {
    uVar37 = 0;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x200000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar33 = (uint)(*(ulong *)&src->field_0x8 >> 0x31) & 1;
  if ((uVar10 & 0x2000000000000) == 0) {
    uVar33 = 0;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x2000000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar29 = (uint)(*(ulong *)&src->field_0x8 >> 0x34) & 1;
  if ((uVar10 & 0x10000000000000) == 0) {
    uVar29 = 0;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x10000000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar7 = (uint)(*(ulong *)&src->field_0x8 >> 0x35) & 1;
  if ((uVar10 & 0x20000000000000) == 0) {
    uVar7 = uVar24;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x20000000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar30 = (uint)(*(ulong *)&src->field_0x8 >> 0x36) & 1;
  if ((uVar10 & 0x40000000000000) == 0) {
    uVar30 = 0;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x40000000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar34 = (uint)(*(ulong *)&src->field_0x8 >> 0x37) & 1;
  if ((uVar10 & 0x80000000000000) == 0) {
    uVar34 = 0;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x80000000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  bVar25 = (byte)(*(ulong *)&src->field_0x8 >> 0x38) & 1;
  if ((uVar10 & 0x100000000000000) == 0) {
    bVar25 = 0;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x100000000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar35 = (uint)(*(ulong *)&src->field_0x8 >> 0x39) & 1;
  if ((uVar10 >> 0x39 & 1) == 0) {
    uVar35 = 0;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x200000000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar23 = (uint)(*(ulong *)&src->field_0x8 >> 0x32) & 1;
  if ((uVar10 >> 0x32 & 1) == 0) {
    uVar23 = 0;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x4000000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar8 = (uint)(*(ulong *)&src->field_0x8 >> 0x33) & 1;
  if ((uVar10 >> 0x33 & 1) == 0) {
    uVar8 = uVar24;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x8000000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar24 = (uint)(*(ulong *)&src->field_0x8 >> 0x2e) & 1;
  if ((uVar10 >> 0x2e & 1) == 0) {
    uVar24 = 0;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x400000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar36 = (uint)(*(ulong *)&src->field_0x8 >> 0x2f) & 1;
  if ((uVar10 >> 0x2f & 1) == 0) {
    uVar36 = 0;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x800000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar26 = (ushort)(*(ulong *)&src->field_0x8 >> 0x30) & 1;
  if ((uVar10 >> 0x30 & 1) == 0) {
    uVar26 = 0;
  }
  uVar17 = *(ulong *)&src->field_0x8 & 0x1000000000000 | uVar17;
  *(ulong *)&dst->field_0x8 = uVar17;
  uVar18 = (uint)(*(ulong *)&src->field_0x8 >> 0x21) & 1;
  if ((uVar10 >> 0x21 & 1) == 0) {
    uVar18 = 0;
  }
  *(ulong *)&dst->field_0x8 = *(ulong *)&src->field_0x8 & 0x200000000 | uVar17;
  dst->spirvStorageClass = src->spirvStorageClass;
  pTVar3 = src->spirvDecorate;
  if (pTVar3 != (TSpirvDecorate *)0x0) {
    this_00 = dst->spirvDecorate;
    if (this_00 == (TSpirvDecorate *)0x0) {
      dst->spirvDecorate = pTVar3;
    }
    else {
      p_Var11 = (pTVar3->decorates).
                super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var19 = &(pTVar3->decorates).
                 super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                 ._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var11 != p_Var19) {
        p_Var1 = &(this_00->decorates).
                  super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                  ._M_t._M_impl.super__Rb_tree_header;
        do {
          p_Var12 = (this_00->decorates).
                    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var12 == (_Base_ptr)0x0) {
LAB_004262dd:
            std::
            _Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>>
            ::
            _M_insert_unique<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>const&>
                      ((_Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>>
                        *)this_00,
                       (pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *)
                       (p_Var11 + 1));
          }
          else {
            iVar9 = ((pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *)
                    (p_Var11 + 1))->first;
            p_Var15 = &p_Var1->_M_header;
            do {
              if (iVar9 <= (int)*(size_t *)(p_Var12 + 1)) {
                p_Var15 = p_Var12;
              }
              p_Var12 = (&p_Var12->_M_left)[(int)*(size_t *)(p_Var12 + 1) < iVar9];
            } while (p_Var12 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var15 == p_Var1) ||
               (iVar9 < (int)((_Rb_tree_header *)p_Var15)->_M_node_count)) goto LAB_004262dd;
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"too many SPIR-V decorate qualifiers","spirv_decorate",
                       "(decoration=%u)");
          }
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != p_Var19);
      }
      p_Var11 = (pTVar3->decorateIds).
                super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var19 = &(pTVar3->decorateIds).
                 super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                 ._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var11 != p_Var19) {
        p_Var1 = &(this_00->decorateIds).
                  super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                  ._M_t._M_impl.super__Rb_tree_header;
        do {
          p_Var12 = (this_00->decorateIds).
                    super_map<int,_glslang::TVector<const_glslang::TIntermTyped_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var12 == (_Base_ptr)0x0) {
LAB_00426370:
            std::
            _Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>>>
            ::
            _M_insert_unique<std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>const&>
                      ((_Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermTyped_const*>>>>
                        *)&this_00->decorateIds,
                       (pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_> *)
                       (p_Var11 + 1));
          }
          else {
            iVar9 = ((pair<const_int,_glslang::TVector<const_glslang::TIntermTyped_*>_> *)
                    (p_Var11 + 1))->first;
            p_Var15 = &p_Var1->_M_header;
            do {
              if (iVar9 <= (int)*(size_t *)(p_Var12 + 1)) {
                p_Var15 = p_Var12;
              }
              p_Var12 = (&p_Var12->_M_left)[(int)*(size_t *)(p_Var12 + 1) < iVar9];
            } while (p_Var12 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var15 == p_Var1) ||
               (iVar9 < (int)((_Rb_tree_header *)p_Var15)->_M_node_count)) goto LAB_00426370;
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"too many SPIR-V decorate qualifiers","spirv_decorate_id",
                       "(decoration=%u)");
          }
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != p_Var19);
      }
      p_Var11 = (pTVar3->decorateStrings).
                super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                ._M_t._M_impl.super__Rb_tree_header._M_header._M_left;
      p_Var19 = &(pTVar3->decorateStrings).
                 super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                 ._M_t._M_impl.super__Rb_tree_header;
      if ((_Rb_tree_header *)p_Var11 != p_Var19) {
        p_Var1 = &(this_00->decorates).
                  super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                  ._M_t._M_impl.super__Rb_tree_header;
        do {
          p_Var12 = (this_00->decorates).
                    super_map<int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_>_>_>
                    ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
          if (p_Var12 == (_Base_ptr)0x0) {
LAB_0042640f:
            std::
            _Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>>
            ::
            _M_insert_unique<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>const&>
                      ((_Rb_tree<int,std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>,std::_Select1st<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>,std::less<int>,glslang::pool_allocator<std::pair<int_const,glslang::TVector<glslang::TIntermConstantUnion_const*>>>>
                        *)&this_00->decorateStrings,
                       (pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *)
                       (p_Var11 + 1));
          }
          else {
            iVar9 = ((pair<const_int,_glslang::TVector<const_glslang::TIntermConstantUnion_*>_> *)
                    (p_Var11 + 1))->first;
            p_Var15 = &p_Var1->_M_header;
            do {
              if (iVar9 <= (int)*(size_t *)(p_Var12 + 1)) {
                p_Var15 = p_Var12;
              }
              p_Var12 = (&p_Var12->_M_left)[(int)*(size_t *)(p_Var12 + 1) < iVar9];
            } while (p_Var12 != (_Base_ptr)0x0);
            if (((_Rb_tree_header *)p_Var15 == p_Var1) ||
               (iVar9 < (int)((_Rb_tree_header *)p_Var15)->_M_node_count)) goto LAB_0042640f;
            (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d])
                      (this,loc,"too many SPIR-V decorate qualifiers","spirv_decorate_string",
                       "(decoration=%u)");
          }
          p_Var11 = (_Base_ptr)std::_Rb_tree_increment(p_Var11);
        } while ((_Rb_tree_header *)p_Var11 != p_Var19);
      }
    }
  }
  if ((uVar18 == 0 && (uVar26 == 0 && (uVar36 == 0 && (uVar24 == 0 && uVar8 == 0)))) &&
      (uVar23 == 0 &&
      ((uVar35 == 0 && (bVar25 == 0 && (uVar34 == 0 && uVar30 == 0))) &&
      (uVar7 == 0 &&
      ((uVar29 == 0 && (uVar33 == 0 && (uVar37 == 0 && uVar6 == 0))) &&
      (uVar22 == 0 &&
      ((uVar28 == 0 && (uVar32 == 0 && (uVar21 == 0 && uVar27 == 0))) &&
      (uVar5 == 0 &&
      (uVar31 == 0 &&
      ((((byte)((ulong)uVar2 >> 0x18) >> 7 & (int)uVar13 < 0) == 0 && uVar4 == 0) &&
      (uVar14 == 0 && uVar20 == 0))))))))))) {
    return;
  }
  UNRECOVERED_JUMPTABLE =
       (this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x2d];
  (*UNRECOVERED_JUMPTABLE)(this,loc,"replicated qualifiers","","",UNRECOVERED_JUMPTABLE);
  return;
}

Assistant:

void TParseContext::mergeQualifiers(const TSourceLoc& loc, TQualifier& dst, const TQualifier& src, bool force)
{
    // Multiple auxiliary qualifiers (mostly done later by 'individual qualifiers')
    if (src.isAuxiliary() && dst.isAuxiliary())
        error(loc, "can only have one auxiliary qualifier (centroid, patch, and sample)", "", "");

    // Multiple interpolation qualifiers (mostly done later by 'individual qualifiers')
    if (src.isInterpolation() && dst.isInterpolation())
        error(loc, "can only have one interpolation qualifier (flat, smooth, noperspective, __explicitInterpAMD)", "", "");

    // Ordering
    if (! force && ((!isEsProfile() && version < 420) ||
                    (isEsProfile() && version < 310))
                && ! extensionTurnedOn(E_GL_ARB_shading_language_420pack)) {
        // non-function parameters
        if (src.isNoContraction() && (dst.invariant || dst.isInterpolation() || dst.isAuxiliary() || dst.storage != EvqTemporary || dst.precision != EpqNone))
            error(loc, "precise qualifier must appear first", "", "");
        if (src.invariant && (dst.isInterpolation() || dst.isAuxiliary() || dst.storage != EvqTemporary || dst.precision != EpqNone))
            error(loc, "invariant qualifier must appear before interpolation, storage, and precision qualifiers ", "", "");
        else if (src.isInterpolation() && (dst.isAuxiliary() || dst.storage != EvqTemporary || dst.precision != EpqNone))
            error(loc, "interpolation qualifiers must appear before storage and precision qualifiers", "", "");
        else if (src.isAuxiliary() && (dst.storage != EvqTemporary || dst.precision != EpqNone))
            error(loc, "Auxiliary qualifiers (centroid, patch, and sample) must appear before storage and precision qualifiers", "", "");
        else if (src.storage != EvqTemporary && (dst.precision != EpqNone))
            error(loc, "precision qualifier must appear as last qualifier", "", "");

        // function parameters
        if (src.isNoContraction() && (dst.storage == EvqConst || dst.storage == EvqIn || dst.storage == EvqOut))
            error(loc, "precise qualifier must appear first", "", "");
        if (src.storage == EvqConst && (dst.storage == EvqIn || dst.storage == EvqOut))
            error(loc, "in/out must appear before const", "", "");
    }

    // Storage qualification
    if (dst.storage == EvqTemporary || dst.storage == EvqGlobal)
        dst.storage = src.storage;
    else if ((dst.storage == EvqIn  && src.storage == EvqOut) ||
             (dst.storage == EvqOut && src.storage == EvqIn))
        dst.storage = EvqInOut;
    else if ((dst.storage == EvqIn    && src.storage == EvqConst) ||
             (dst.storage == EvqConst && src.storage == EvqIn))
        dst.storage = EvqConstReadOnly;
    else if (src.storage != EvqTemporary &&
             src.storage != EvqGlobal)
        error(loc, "too many storage qualifiers", GetStorageQualifierString(src.storage), "");

    // Precision qualifiers
    if (! force && src.precision != EpqNone && dst.precision != EpqNone)
        error(loc, "only one precision qualifier allowed", GetPrecisionQualifierString(src.precision), "");
    if (dst.precision == EpqNone || (force && src.precision != EpqNone))
        dst.precision = src.precision;

    if (!force && ((src.coherent && (dst.devicecoherent || dst.queuefamilycoherent || dst.workgroupcoherent || dst.subgroupcoherent || dst.shadercallcoherent)) ||
                   (src.devicecoherent && (dst.coherent || dst.queuefamilycoherent || dst.workgroupcoherent || dst.subgroupcoherent || dst.shadercallcoherent)) ||
                   (src.queuefamilycoherent && (dst.coherent || dst.devicecoherent || dst.workgroupcoherent || dst.subgroupcoherent || dst.shadercallcoherent)) ||
                   (src.workgroupcoherent && (dst.coherent || dst.devicecoherent || dst.queuefamilycoherent || dst.subgroupcoherent || dst.shadercallcoherent)) ||
                   (src.subgroupcoherent  && (dst.coherent || dst.devicecoherent || dst.queuefamilycoherent || dst.workgroupcoherent || dst.shadercallcoherent)) ||
                   (src.shadercallcoherent && (dst.coherent || dst.devicecoherent || dst.queuefamilycoherent || dst.workgroupcoherent || dst.subgroupcoherent)))) {
        error(loc, "only one coherent/devicecoherent/queuefamilycoherent/workgroupcoherent/subgroupcoherent/shadercallcoherent qualifier allowed",
            GetPrecisionQualifierString(src.precision), "");
    }

    // Layout qualifiers
    mergeObjectLayoutQualifiers(dst, src, false);

    // individual qualifiers
    bool repeated = false;
    #define MERGE_SINGLETON(field) repeated |= dst.field && src.field; dst.field |= src.field;
    MERGE_SINGLETON(invariant);
    MERGE_SINGLETON(centroid);
    MERGE_SINGLETON(smooth);
    MERGE_SINGLETON(flat);
    MERGE_SINGLETON(specConstant);
    MERGE_SINGLETON(noContraction);
    MERGE_SINGLETON(nopersp);
    MERGE_SINGLETON(explicitInterp);
    MERGE_SINGLETON(perPrimitiveNV);
    MERGE_SINGLETON(perViewNV);
    MERGE_SINGLETON(perTaskNV);
    MERGE_SINGLETON(patch);
    MERGE_SINGLETON(sample);
    MERGE_SINGLETON(coherent);
    MERGE_SINGLETON(devicecoherent);
    MERGE_SINGLETON(queuefamilycoherent);
    MERGE_SINGLETON(workgroupcoherent);
    MERGE_SINGLETON(subgroupcoherent);
    MERGE_SINGLETON(shadercallcoherent);
    MERGE_SINGLETON(nonprivate);
    MERGE_SINGLETON(volatil);
    MERGE_SINGLETON(nontemporal);
    MERGE_SINGLETON(restrict);
    MERGE_SINGLETON(readonly);
    MERGE_SINGLETON(writeonly);
    MERGE_SINGLETON(nonUniform);

    // SPIR-V storage class qualifier (GL_EXT_spirv_intrinsics)
    dst.spirvStorageClass = src.spirvStorageClass;

    // SPIR-V decorate qualifiers (GL_EXT_spirv_intrinsics)
    if (src.hasSpirvDecorate()) {
        if (dst.hasSpirvDecorate()) {
            const TSpirvDecorate& srcSpirvDecorate = src.getSpirvDecorate();
            TSpirvDecorate& dstSpirvDecorate = dst.getSpirvDecorate();
            for (auto& decorate : srcSpirvDecorate.decorates) {
                if (dstSpirvDecorate.decorates.find(decorate.first) != dstSpirvDecorate.decorates.end())
                    error(loc, "too many SPIR-V decorate qualifiers", "spirv_decorate", "(decoration=%u)", decorate.first);
                else
                    dstSpirvDecorate.decorates.insert(decorate);
            }

            for (auto& decorateId : srcSpirvDecorate.decorateIds) {
                if (dstSpirvDecorate.decorateIds.find(decorateId.first) != dstSpirvDecorate.decorateIds.end())
                    error(loc, "too many SPIR-V decorate qualifiers", "spirv_decorate_id", "(decoration=%u)", decorateId.first);
                else
                    dstSpirvDecorate.decorateIds.insert(decorateId);
            }

            for (auto& decorateString : srcSpirvDecorate.decorateStrings) {
                if (dstSpirvDecorate.decorates.find(decorateString.first) != dstSpirvDecorate.decorates.end())
                    error(loc, "too many SPIR-V decorate qualifiers", "spirv_decorate_string", "(decoration=%u)", decorateString.first);
                else
                    dstSpirvDecorate.decorateStrings.insert(decorateString);
            }
        } else {
            dst.spirvDecorate = src.spirvDecorate;
        }
    }

    if (repeated)
        error(loc, "replicated qualifiers", "", "");
}